

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O3

LatencyItem * __thiscall MapWrapper::addItem(MapWrapper *this,string *bin_name)

{
  pointer pcVar1;
  LatencyItem *this_00;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  LatencyItem *local_28;
  
  this_00 = (LatencyItem *)operator_new(0x50);
  LatencyItem::LatencyItem(this_00,bin_name);
  pcVar1 = (bin_name->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + bin_name->_M_string_length);
  local_28 = this_00;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LatencyItem*>,std::allocator<std::pair<std::__cxx11::string_const,LatencyItem*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,LatencyItem*>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LatencyItem*>,std::allocator<std::pair<std::__cxx11::string_const,LatencyItem*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this,local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return this_00;
}

Assistant:

LatencyItem* addItem(const std::string& bin_name) {
        LatencyItem* item = new LatencyItem(bin_name);
        map.insert( std::make_pair(bin_name, item) );
        return item;
    }